

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O1

string * __thiscall
vkt::(anonymous_namespace)::clearColorToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkFormat vkFormat,
          VkClearColorValue value)

{
  TextureChannelClass TVar1;
  undefined4 in_register_00000014;
  int i;
  long lVar2;
  BVec4 channelMask;
  TextureFormat format;
  ostringstream stream;
  tcu local_1c4 [4];
  undefined8 local_1c0;
  undefined8 local_1b8;
  TextureFormat local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = CONCAT44(in_register_00000014,vkFormat);
  local_1b8 = value._0_8_;
  local_1b0 = ::vk::mapVkFormat((VkFormat)this);
  TVar1 = tcu::getTextureChannelClass(local_1b0.type);
  tcu::getTextureFormatChannelMask(local_1c4,&local_1b0);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      if (local_1c4[lVar2] == (tcu)0x1) {
        std::ostream::_M_insert<double>((double)*(float *)((long)&local_1c0 + lVar2 * 4));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Undef",5);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      if (local_1c4[lVar2] == (tcu)0x1) {
        std::ostream::operator<<((ostream *)local_1a8,*(int *)((long)&local_1c0 + lVar2 * 4));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Undef",5);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      if (local_1c4[lVar2] == (tcu)0x1) {
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Undef",5);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string clearColorToString (VkFormat vkFormat, VkClearColorValue value)
{
	const tcu::TextureFormat		format			= mapVkFormat(vkFormat);
	const tcu::TextureChannelClass	channelClass	= tcu::getTextureChannelClass(format.type);
	const tcu::BVec4				channelMask		= tcu::getTextureFormatChannelMask(format);

	std::ostringstream				stream;

	stream << "(";

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			for (int i = 0; i < 4; i++)
			{
				if (i > 0)
					stream << ", ";

				if (channelMask[i])
					stream << value.int32[i];
				else
					stream << "Undef";
			}
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			for (int i = 0; i < 4; i++)
			{
				if (i > 0)
					stream << ", ";

				if (channelMask[i])
					stream << value.uint32[i];
				else
					stream << "Undef";
			}
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			for (int i = 0; i < 4; i++)
			{
				if (i > 0)
					stream << ", ";

				if (channelMask[i])
					stream << value.float32[i];
				else
					stream << "Undef";
			}
			break;

		default:
			DE_FATAL("Unknown channel class");
	}

	stream << ")";

	return stream.str();
}